

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  pointer puVar1;
  pointer puVar2;
  wabt *this_00;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  size_type __new_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  char *pcVar5;
  Enum EVar6;
  string filename_str;
  stat statbuf;
  wabt *local_1058 [2];
  long local_1048 [2];
  stat local_1038 [28];
  
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)filename._M_str;
  pcVar5 = (char *)filename._M_len;
  local_1058[0] = (wabt *)local_1048;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1058,pcVar5,pcVar5 + (long)this);
  this_00 = local_1058[0];
  if ((this == (wabt *)0x1) && (*pcVar5 == '-')) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,0);
    sVar4 = fread(local_1038,1,0x1000,_stdin);
    if (sVar4 != 0) {
      do {
        puVar1 = (this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar2 = (this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (this_01,(size_type)(puVar1 + (sVar4 - (long)puVar2)));
        memcpy(puVar1 + ((long)(this_01->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start - (long)puVar2),local_1038,
               sVar4);
        sVar4 = fread(local_1038,1,0x1000,_stdin);
      } while (sVar4 != 0);
    }
    iVar3 = ferror(_stdin);
    if (iVar3 != 0) {
      ReadFile();
    }
    EVar6 = (Enum)(iVar3 != 0);
    goto LAB_001266f6;
  }
  iVar3 = stat((char *)local_1058[0],local_1038);
  if (iVar3 < 0) {
    ReadFile(this_00);
  }
  else if ((local_1038[0].st_mode._1_1_ & 0x80) == 0) {
    fprintf(_stderr,"%s: not a regular file\n",this_00);
  }
  else {
    __stream = fopen((char *)this_00,"rb");
    if (__stream == (FILE *)0x0) {
      ReadFile(this_00);
    }
    else {
      iVar3 = fseek(__stream,0,2);
      if (iVar3 < 0) {
        pcVar5 = "fseek to end failed";
      }
      else {
        __new_size = ftell(__stream);
        if ((long)__new_size < 0) {
          pcVar5 = "ftell failed";
        }
        else {
          iVar3 = fseek(__stream,0,0);
          if (-1 < iVar3) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,__new_size);
            if (__new_size != 0) {
              sVar4 = fread((this_01->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start,__new_size,1,__stream);
              if (sVar4 != 1) {
                ReadFile();
                goto LAB_001266f0;
              }
            }
            fclose(__stream);
            EVar6 = Ok;
            goto LAB_001266f6;
          }
          pcVar5 = "fseek to beginning failed";
        }
      }
      perror(pcVar5);
      fclose(__stream);
    }
  }
LAB_001266f0:
  EVar6 = Error;
LAB_001266f6:
  if (local_1058[0] != (wabt *)local_1048) {
    operator_delete(local_1058[0],local_1048[0] + 1);
  }
  return (Result)EVar6;
}

Assistant:

Result ReadFile(std::string_view filename, std::vector<uint8_t>* out_data) {
  std::string filename_str(filename);
  const char* filename_cstr = filename_str.c_str();

  if (filename == "-") {
    return ReadStdin(out_data);
  }

  struct stat statbuf;
  if (stat(filename_cstr, &statbuf) < 0) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (!(statbuf.st_mode & S_IFREG)) {
    fprintf(stderr, "%s: not a regular file\n", filename_cstr);
    return Result::Error;
  }

  FILE* infile = fopen(filename_cstr, "rb");
  if (!infile) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    perror("fseek to end failed");
    fclose(infile);
    return Result::Error;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    fprintf(stderr, "%s: fread failed: %s\n", filename_cstr, strerror(errno));
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}